

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileContext.cpp
# Opt level: O3

string * __thiscall
enact::CompileContext::getSourceLine_abi_cxx11_
          (string *__return_storage_ptr__,CompileContext *this,line_t line)

{
  char cVar1;
  istream *piVar2;
  uint uVar3;
  bool bVar4;
  istringstream stream;
  long local_1a8 [15];
  ios_base local_130 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a8,(string *)this,_S_in);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = 1;
  do {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)__return_storage_ptr__,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    bVar4 = uVar3 < line;
    uVar3 = uVar3 + 1;
  } while (bVar4);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1a8);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string CompileContext::getSourceLine(line_t line) {
        std::istringstream stream{m_source};
        line_t lineNumber{1};
        std::string lineContents;

        while (std::getline(stream, lineContents) && lineNumber < line) {
            ++lineNumber;
        }

        return lineContents;
    }